

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

bool __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::tryReadjustFreeSpace
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this,GrowthPosition pos,qsizetype n
          ,ButtonInfo **data)

{
  ulong uVar1;
  Data *pDVar2;
  ButtonInfo *__src;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  pDVar2 = this->d;
  if (pDVar2 == (Data *)0x0) {
    return false;
  }
  lVar4 = (pDVar2->super_QArrayData).alloc;
  __src = this->ptr;
  uVar3 = this->size;
  lVar6 = (long)__src - ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
  ;
  lVar5 = (lVar6 >> 3) * 0x79435e50d79435e5;
  if ((pos == GrowsAtEnd) && (0 < lVar6)) {
    lVar6 = 0;
    if (SBORROW8(uVar3 * 3,lVar4 * 2) == (long)(uVar3 * 3 + lVar4 * -2) < 0) goto LAB_00369cf1;
  }
  else {
    lVar6 = 0;
    if ((pos != GrowsAtBeginning) ||
       ((uVar1 = lVar4 + lVar5, uVar1 == uVar3 || (long)(uVar1 - uVar3) < 0 ||
        (lVar6 = 0, lVar4 <= (long)(uVar3 * 3))))) goto LAB_00369cf1;
    lVar4 = (long)(lVar4 + ~uVar3) / 2;
    lVar6 = 0;
    if (0 < lVar4) {
      lVar6 = lVar4;
    }
    lVar6 = lVar6 + 1;
  }
  lVar6 = lVar6 + lVar5;
  if (((uVar3 != 0) && (__src != (ButtonInfo *)0x0)) && (lVar6 != 0)) {
    memmove(__src + lVar6,__src,uVar3 * 0x98);
  }
  this->ptr = __src + lVar6;
  lVar6 = 1;
LAB_00369cf1:
  return SUB81(lVar6,0);
}

Assistant:

bool tryReadjustFreeSpace(QArrayData::GrowthPosition pos, qsizetype n, const T **data = nullptr)
    {
        Q_ASSERT(!this->needsDetach());
        Q_ASSERT(n > 0);
        Q_ASSERT((pos == QArrayData::GrowsAtEnd && this->freeSpaceAtEnd() < n)
                 || (pos == QArrayData::GrowsAtBeginning && this->freeSpaceAtBegin() < n));

        const qsizetype capacity = this->constAllocatedCapacity();
        const qsizetype freeAtBegin = this->freeSpaceAtBegin();
        const qsizetype freeAtEnd = this->freeSpaceAtEnd();

        qsizetype dataStartOffset = 0;
        // algorithm:
        //   a. GrowsAtEnd: relocate if space at begin AND size < (capacity * 2) / 3
        //      [all goes to free space at end]:
        //      new free space at begin = 0
        //
        //   b. GrowsAtBeginning: relocate if space at end AND size < capacity / 3
        //      [balance the free space]:
        //      new free space at begin = n + (total free space - n) / 2
        if (pos == QArrayData::GrowsAtEnd && freeAtBegin >= n
            && ((3 * this->size) < (2 * capacity))) {
            // dataStartOffset = 0; - done in declaration
        } else if (pos == QArrayData::GrowsAtBeginning && freeAtEnd >= n
                   && ((3 * this->size) < capacity)) {
            // total free space == capacity - size
            dataStartOffset = n + qMax(0, (capacity - this->size - n) / 2);
        } else {
            // nothing to do otherwise
            return false;
        }

        relocate(dataStartOffset - freeAtBegin, data);

        Q_ASSERT((pos == QArrayData::GrowsAtEnd && this->freeSpaceAtEnd() >= n)
                 || (pos == QArrayData::GrowsAtBeginning && this->freeSpaceAtBegin() >= n));
        return true;
    }